

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorSet::FileDescriptorSet(FileDescriptorSet *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  InternalMetadataWithArena *in_stack_ffffffffffffffc0;
  
  Message::Message((Message *)in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__FileDescriptorSet_00967030;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  memset(in_RDI + 2,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x509622);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)0x509635);
  SharedCtor((FileDescriptorSet *)0x509641);
  return;
}

Assistant:

FileDescriptorSet::FileDescriptorSet()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.FileDescriptorSet)
}